

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.hpp
# Opt level: O2

Scoped * __thiscall
diy::stats::Profiler::scoped(Scoped *__return_storage_ptr__,Profiler *this,string *name)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)name);
  ScopedProfile<diy::stats::Profiler>::ScopedProfile(__return_storage_ptr__,this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

Scoped  scoped(std::string name)            { return Scoped(*this, name); }